

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Map.cpp
# Opt level: O2

void __thiscall RenX::Map::Map(Map *this,string_view in_name)

{
  basic_string_view<char,_std::char_traits<char>_> local_20;
  
  local_20._M_str = in_name._M_str;
  local_20._M_len = in_name._M_len;
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  (this->name)._M_string_length = 0;
  (this->name).field_2._M_local_buf[0] = '\0';
  this->guid[0] = 0;
  this->guid[1] = 0;
  std::__cxx11::string::assign<std::basic_string_view<char,std::char_traits<char>>>
            ((string *)&this->name,&local_20);
  return;
}

Assistant:

RenX::Map::Map(std::string_view in_name) : Map()
{
	name = in_name;
}